

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlNodePtr xmlStaticCopyNode(xmlNodePtr node,xmlDocPtr doc,xmlNodePtr parent,int extended)

{
  _xmlNode *p_Var1;
  xmlElementType xVar2;
  int iVar3;
  xmlNsPtr in_RAX;
  xmlNodePtr pxVar4;
  xmlChar *pxVar5;
  xmlDocPtr pxVar6;
  xmlNsPtr pxVar7;
  xmlAttrPtr pxVar8;
  xmlEntityPtr pxVar9;
  xmlNodePtr pxVar10;
  xmlRegisterNodeFunc *pp_Var11;
  xmlNs *pxVar12;
  _xmlNode **pp_Var13;
  _xmlNode *parent_00;
  _xmlNode *node_00;
  xmlNsPtr ns;
  
  if (node == (xmlNodePtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  switch(node->type) {
  case XML_ELEMENT_NODE:
  case XML_TEXT_NODE:
  case XML_CDATA_SECTION_NODE:
  case XML_ENTITY_REF_NODE:
  case XML_PI_NODE:
  case XML_COMMENT_NODE:
  case XML_DOCUMENT_FRAG_NODE:
  case XML_XINCLUDE_START:
  case XML_XINCLUDE_END:
    break;
  case XML_ATTRIBUTE_NODE:
    pxVar4 = (xmlNodePtr)xmlCopyPropInternal(doc,parent,(xmlAttrPtr)node);
    return pxVar4;
  default:
    return (xmlNodePtr)0x0;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    pxVar6 = xmlCopyDoc((xmlDocPtr)node,extended);
    return (xmlNodePtr)pxVar6;
  case XML_NAMESPACE_DECL:
    pxVar4 = (xmlNodePtr)xmlCopyNamespaceList((xmlNsPtr)node);
    return pxVar4;
  }
  ns = in_RAX;
  pxVar4 = (xmlNodePtr)(*xmlMalloc)(0x78);
  if (pxVar4 == (xmlNodePtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  pxVar4->nsDef = (xmlNs *)0x0;
  pxVar4->psvi = (void *)0x0;
  pxVar4->content = (xmlChar *)0x0;
  pxVar4->properties = (_xmlAttr *)0x0;
  pxVar4->doc = (_xmlDoc *)0x0;
  pxVar4->ns = (xmlNs *)0x0;
  pxVar4->next = (_xmlNode *)0x0;
  pxVar4->prev = (_xmlNode *)0x0;
  pxVar4->last = (_xmlNode *)0x0;
  pxVar4->parent = (_xmlNode *)0x0;
  pxVar4->name = (xmlChar *)0x0;
  pxVar4->children = (_xmlNode *)0x0;
  pxVar4->line = 0;
  pxVar4->extra = 0;
  *(undefined4 *)&pxVar4->field_0x74 = 0;
  pxVar4->_private = (void *)0x0;
  *(undefined8 *)&pxVar4->type = 0;
  xVar2 = node->type;
  pxVar4->type = xVar2;
  pxVar4->doc = doc;
  pxVar4->parent = parent;
  pxVar5 = node->name;
  if (pxVar5 == "text") {
    pxVar5 = "text";
LAB_00148829:
    pxVar4->name = pxVar5;
  }
  else {
    if (pxVar5 == "textnoenc") {
      pxVar5 = "textnoenc";
      goto LAB_00148829;
    }
    if (pxVar5 == "comment") {
      pxVar5 = "comment";
      goto LAB_00148829;
    }
    if (pxVar5 != (xmlChar *)0x0) {
      if ((doc == (xmlDocPtr)0x0) || (doc->dict == (xmlDictPtr)0x0)) {
        pxVar5 = xmlStrdup(pxVar5);
      }
      else {
        pxVar5 = xmlDictLookup(doc->dict,pxVar5,-1);
      }
      pxVar4->name = pxVar5;
      if (pxVar5 == (xmlChar *)0x0) goto LAB_00148a6e;
      xVar2 = node->type;
    }
  }
  if (xVar2 == XML_ELEMENT_NODE) {
    pxVar4->line = node->line;
  }
  else if ((node->content != (xmlChar *)0x0) &&
          ((XML_XINCLUDE_END < xVar2 ||
           ((0x180020U >> (xVar2 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)))) {
    pxVar5 = xmlStrdup(node->content);
    pxVar4->content = pxVar5;
    if (pxVar5 == (xmlChar *)0x0) goto LAB_00148a6e;
  }
  if (extended == 0) goto LAB_001489f7;
  xVar2 = node->type;
  if (((xVar2 == XML_XINCLUDE_START) || (xVar2 == XML_ELEMENT_NODE)) &&
     (node->nsDef != (xmlNsPtr)0x0)) {
    pxVar7 = xmlCopyNamespaceList(node->nsDef);
    pxVar4->nsDef = pxVar7;
    if (pxVar7 == (xmlNsPtr)0x0) goto LAB_00148a6e;
    xVar2 = node->type;
  }
  if (xVar2 == XML_ELEMENT_NODE) {
    if (node->ns != (xmlNs *)0x0) {
      ns = (xmlNsPtr)0x0;
      iVar3 = xmlSearchNsSafe(pxVar4,node->ns->prefix,&ns);
      if (iVar3 < 0) goto LAB_00148a6e;
      if (ns == (xmlNsPtr)0x0) {
        iVar3 = xmlSearchNsSafe(node,node->ns->prefix,&ns);
        if (iVar3 < 0) goto LAB_00148a6e;
        p_Var1 = pxVar4;
        if (ns == (xmlNsPtr)0x0) {
          pxVar12 = xmlNewReconciledNs(pxVar4,node->ns);
        }
        else {
          do {
            pxVar10 = p_Var1;
            p_Var1 = pxVar10->parent;
          } while (p_Var1 != (_xmlNode *)0x0);
          pxVar12 = xmlNewNs(pxVar10,ns->href,ns->prefix);
        }
        pxVar4->ns = pxVar12;
        if (pxVar12 == (xmlNs *)0x0) goto LAB_00148a6e;
      }
      else {
        pxVar4->ns = ns;
      }
      xVar2 = node->type;
      if (xVar2 != XML_ELEMENT_NODE) goto LAB_001488f7;
    }
    if (node->properties != (xmlAttrPtr)0x0) {
      pxVar8 = xmlCopyPropList(pxVar4,node->properties);
      pxVar4->properties = pxVar8;
      if (pxVar8 == (xmlAttrPtr)0x0) {
LAB_00148a6e:
        xmlFreeNode(pxVar4);
        return (xmlNodePtr)0x0;
      }
      xVar2 = node->type;
      goto LAB_001488f7;
    }
  }
  else {
LAB_001488f7:
    if (xVar2 == XML_ENTITY_REF_NODE) {
      if ((doc == (xmlDocPtr)0x0) || (node->doc != doc)) {
        pxVar9 = xmlGetDocEntity(doc,pxVar4->name);
      }
      else {
        pxVar9 = (xmlEntityPtr)node->children;
      }
      pxVar4->children = (_xmlNode *)pxVar9;
      pxVar4->last = (_xmlNode *)pxVar9;
      goto LAB_001489f7;
    }
  }
  pxVar10 = pxVar4;
  p_Var1 = node->children;
  if (extended != 2 && node->children != (xmlNodePtr)0x0) {
LAB_0014893a:
    node_00 = p_Var1;
    parent_00 = pxVar10;
    if (node_00 != (xmlNodePtr)0x0) {
      pxVar10 = xmlStaticCopyNode(node_00,doc,parent_00,2);
      if (pxVar10 == (xmlNodePtr)0x0) goto LAB_00148a6e;
      p_Var1 = parent_00->last;
      if (p_Var1 != pxVar10) {
        if (p_Var1 == (_xmlNode *)0x0) {
          pp_Var13 = &parent_00->children;
        }
        else {
          pxVar10->prev = p_Var1;
          pp_Var13 = &p_Var1->next;
        }
        *pp_Var13 = pxVar10;
        parent_00->last = pxVar10;
      }
      if ((node_00->type == XML_ENTITY_REF_NODE) ||
         (p_Var1 = node_00->children, node_00->children == (_xmlNode *)0x0)) {
        do {
          pxVar10 = parent_00;
          p_Var1 = node_00->next;
          if (node_00->next != (_xmlNode *)0x0) goto LAB_0014893a;
          node_00 = node_00->parent;
          parent_00 = parent_00->parent;
        } while (node_00 != node);
        pxVar10 = parent_00;
        p_Var1 = (xmlNodePtr)0x0;
      }
      goto LAB_0014893a;
    }
  }
LAB_001489f7:
  if ((xmlRegisterCallbacks != 0) &&
     (pp_Var11 = __xmlRegisterNodeDefaultValue(), *pp_Var11 != (xmlRegisterNodeFunc)0x0)) {
    pp_Var11 = __xmlRegisterNodeDefaultValue();
    (**pp_Var11)(pxVar4);
  }
  return pxVar4;
}

Assistant:

xmlNodePtr
xmlStaticCopyNode(xmlNodePtr node, xmlDocPtr doc, xmlNodePtr parent,
                  int extended) {
    xmlNodePtr ret;

    if (node == NULL) return(NULL);
    switch (node->type) {
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_ELEMENT_NODE:
        case XML_DOCUMENT_FRAG_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
	    break;
        case XML_ATTRIBUTE_NODE:
		return((xmlNodePtr) xmlCopyPropInternal(doc, parent, (xmlAttrPtr) node));
        case XML_NAMESPACE_DECL:
	    return((xmlNodePtr) xmlCopyNamespaceList((xmlNsPtr) node));

        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
	    return((xmlNodePtr) xmlCopyDoc((xmlDocPtr) node, extended));
        default:
            return(NULL);
    }

    /*
     * Allocate a new node and fill the fields.
     */
    ret = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    if (ret == NULL)
	return(NULL);
    memset(ret, 0, sizeof(xmlNode));
    ret->type = node->type;

    ret->doc = doc;
    ret->parent = parent;
    if (node->name == xmlStringText)
	ret->name = xmlStringText;
    else if (node->name == xmlStringTextNoenc)
	ret->name = xmlStringTextNoenc;
    else if (node->name == xmlStringComment)
	ret->name = xmlStringComment;
    else if (node->name != NULL) {
        if ((doc != NULL) && (doc->dict != NULL))
	    ret->name = xmlDictLookup(doc->dict, node->name, -1);
	else
	    ret->name = xmlStrdup(node->name);
        if (ret->name == NULL)
            goto error;
    }
    if ((node->type != XML_ELEMENT_NODE) &&
	(node->content != NULL) &&
	(node->type != XML_ENTITY_REF_NODE) &&
	(node->type != XML_XINCLUDE_END) &&
	(node->type != XML_XINCLUDE_START)) {
	ret->content = xmlStrdup(node->content);
        if (ret->content == NULL)
            goto error;
    }else{
      if (node->type == XML_ELEMENT_NODE)
        ret->line = node->line;
    }

    if (!extended)
	goto out;
    if (((node->type == XML_ELEMENT_NODE) ||
         (node->type == XML_XINCLUDE_START)) && (node->nsDef != NULL)) {
        ret->nsDef = xmlCopyNamespaceList(node->nsDef);
        if (ret->nsDef == NULL)
            goto error;
    }

    if ((node->type == XML_ELEMENT_NODE) && (node->ns != NULL)) {
        xmlNsPtr ns = NULL;
        int res;

	res = xmlSearchNsSafe(ret, node->ns->prefix, &ns);
        if (res < 0)
            goto error;
	if (ns == NULL) {
	    /*
	     * Humm, we are copying an element whose namespace is defined
	     * out of the new tree scope. Search it in the original tree
	     * and add it at the top of the new tree.
             *
             * TODO: Searching the original tree seems unnecessary. We
             * already have a namespace URI.
	     */
	    res = xmlSearchNsSafe(node, node->ns->prefix, &ns);
            if (res < 0)
                goto error;
	    if (ns != NULL) {
	        xmlNodePtr root = ret;

		while (root->parent != NULL) root = root->parent;
		ret->ns = xmlNewNs(root, ns->href, ns->prefix);
            } else {
                ret->ns = xmlNewReconciledNs(ret, node->ns);
	    }
            if (ret->ns == NULL)
                goto error;
	} else {
	    /*
	     * reference the existing namespace definition in our own tree.
	     */
	    ret->ns = ns;
	}
    }
    if ((node->type == XML_ELEMENT_NODE) && (node->properties != NULL)) {
        ret->properties = xmlCopyPropList(ret, node->properties);
        if (ret->properties == NULL)
            goto error;
    }
    if (node->type == XML_ENTITY_REF_NODE) {
	if ((doc == NULL) || (node->doc != doc)) {
	    /*
	     * The copied node will go into a separate document, so
	     * to avoid dangling references to the ENTITY_DECL node
	     * we cannot keep the reference. Try to find it in the
	     * target document.
	     */
	    ret->children = (xmlNodePtr) xmlGetDocEntity(doc, ret->name);
	} else {
            ret->children = node->children;
	}
	ret->last = ret->children;
    } else if ((node->children != NULL) && (extended != 2)) {
        xmlNodePtr cur, insert;

        cur = node->children;
        insert = ret;
        while (cur != NULL) {
            xmlNodePtr copy = xmlStaticCopyNode(cur, doc, insert, 2);
            if (copy == NULL)
                goto error;

            /* Check for coalesced text nodes */
            if (insert->last != copy) {
                if (insert->last == NULL) {
                    insert->children = copy;
                } else {
                    copy->prev = insert->last;
                    insert->last->next = copy;
                }
                insert->last = copy;
            }

            if ((cur->type != XML_ENTITY_REF_NODE) &&
                (cur->children != NULL)) {
                cur = cur->children;
                insert = copy;
                continue;
            }

            while (1) {
                if (cur->next != NULL) {
                    cur = cur->next;
                    break;
                }

                cur = cur->parent;
                insert = insert->parent;
                if (cur == node) {
                    cur = NULL;
                    break;
                }
            }
        }
    }

out:
    if ((xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue((xmlNodePtr)ret);
    return(ret);

error:
    xmlFreeNode(ret);
    return(NULL);
}